

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf2c.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  runtime_error *this;
  int *piVar7;
  char *__rhs;
  int iVar8;
  pointer pcVar9;
  vector<char,_std::allocator<char>_> bfContent;
  string bfFilename;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ifstream bfFile;
  ofstream cFile;
  char local_220 [496];
  
  bfFilename._M_dataplus._M_p = (pointer)&bfFilename.field_2;
  bfFilename._M_string_length = 0;
  bfFilename.field_2._M_local_buf[0] = '\0';
  if (argc != 2) {
    if (argc == 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Not enough arguments.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bfFile,*argv,(allocator<char> *)&cFile);
      PrintUsage((string *)&bfFile);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Too much arguments.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bfFile,*argv,(allocator<char> *)&cFile);
      PrintUsage((string *)&bfFile);
    }
    std::__cxx11::string::~string((string *)&bfFile);
    iVar8 = 1;
    goto LAB_00102794;
  }
  std::__cxx11::string::assign((char *)&bfFilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&code,
             "#include <stdio.h>\n#include <stdlib.h>\n\nint main() {\n\tchar* p = calloc(30000, sizeof(char));\n"
             ,(allocator<char> *)&bfFile);
  std::ifstream::ifstream(&bfFile,(string *)&bfFilename,_S_bin|_S_ate);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to open \'");
    poVar3 = std::operator<<(poVar3,(string *)&bfFilename);
    poVar3 = std::operator<<(poVar3,"\'.");
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_001025ce:
    iVar8 = 1;
  }
  else {
    lVar4 = std::istream::tellg();
    std::istream::seekg((long)&bfFile,_S_beg);
    lVar5 = std::istream::tellg();
    if (lVar4 == lVar5) {
      poVar3 = std::operator<<((ostream *)&std::cout,"The file \'");
      poVar3 = std::operator<<(poVar3,(string *)&bfFilename);
      poVar3 = std::operator<<(poVar3,"\' was empty.");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_001025ce;
    }
    std::vector<char,_std::allocator<char>_>::vector
              (&bfContent,lVar4 - lVar5,(allocator_type *)&cFile);
    plVar6 = (long *)std::istream::read((char *)&bfFile,
                                        (long)bfContent.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_458,&bfFilename,": ");
      piVar7 = __errno_location();
      __rhs = strerror(*piVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cFile,
                     &local_458,__rhs);
      std::runtime_error::runtime_error(this,(string *)&cFile);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::close();
    cVar2 = '\x01';
    for (pcVar9 = bfContent.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar9 != bfContent.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish; pcVar9 = pcVar9 + 1) {
      cVar1 = *pcVar9;
      _cFile = local_220;
      std::__cxx11::string::_M_construct((ulong)&cFile,cVar2 - (cVar1 == ']'));
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&cFile);
      switch(cVar1) {
      case '+':
        break;
      case ',':
        break;
      case '-':
        break;
      case '.':
        break;
      default:
        if ((cVar1 == '<') || (cVar1 == '>')) break;
        if (cVar1 == '[') {
          std::__cxx11::string::append((char *)&code);
          cVar2 = cVar2 + '\x01';
        }
        else if (cVar1 == ']') {
          std::__cxx11::string::append((char *)&code);
          cVar2 = cVar2 + -1;
        }
        goto LAB_0010271a;
      }
      std::__cxx11::string::append((char *)&code);
LAB_0010271a:
    }
    std::__cxx11::string::append((char *)&code);
    std::ofstream::ofstream(&cFile,"output.c",_S_out);
    poVar3 = std::operator<<((ostream *)&cFile,(string *)&code);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::~ofstream(&cFile);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&bfContent.super__Vector_base<char,_std::allocator<char>_>);
    iVar8 = 0;
  }
  std::ifstream::~ifstream(&bfFile);
  std::__cxx11::string::~string((string *)&code);
LAB_00102794:
  std::__cxx11::string::~string((string *)&bfFilename);
  return iVar8;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string bfFilename;
    
    if (argc == 1) {
        std::cout << "Not enough arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }
    if (argc == 2) {
        bfFilename = argv[1];
    } else {
        std::cout << "Too much arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }

    std::string code = 
        "#include <stdio.h>" "\n" 
        "#include <stdlib.h>" "\n"
        "\n"
        "int main() {" "\n"
        "\t" "char* p = calloc(30000, sizeof(char));" "\n";
    
    std::ifstream bfFile { bfFilename, std::ios::binary|std::ios::ate };
    
    if (!bfFile.is_open()) {
        std::cout << "Failed to open '" << bfFilename << "'." << std::endl;
        return EXIT_FAILURE;
    }

    auto end = bfFile.tellg();
    bfFile.seekg(0, std::ios::beg);
    auto size = std::size_t(end - bfFile.tellg());

    if (size == 0) {
        std::cout << "The file '" << bfFilename << "' was empty." << std::endl;
        return EXIT_FAILURE;
    }

    std::vector<char> bfContent(size);
    if (!bfFile.read(bfContent.data(), bfContent.size())) {
        throw std::runtime_error(bfFilename + ": " + std::strerror(errno));
    }
    bfFile.close();

    std::size_t tabs = 1;
    for (const char c : bfContent) {
        const std::size_t indent = (c != ']') ? tabs : tabs - 1;
        code += std::string(indent, '\t');
        switch (c) {
            case '>': 
                code += "++p;" "\n";
                break;
            case '<':
                code += "--p;" "\n";
                break;
            case '+':
                code += "++*p;" "\n";
                break;
            case '-':
                code += "--*p;" "\n";
                break;
            case '.':
                code += "putchar(*p);" "\n";
                break;
            case ',':
                code += "*p = getchar();" "\n";
                break;
            case '[':
                code += "while (*p) {" "\n";
                ++tabs;
                break;
            case ']':
                code += "}" "\n";
                --tabs;
                break;
            default: break;
        }
    }

    code += "\t" "free(p);" "\n" "}";

    std::ofstream cFile { "output.c" };
    cFile << code << std::endl;

    return EXIT_SUCCESS;
}